

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

void __thiscall pbrt::Image::SetChannel(Image *this,Point2i p,int c,Float value)

{
  span<unsigned_char> vout;
  span<const_float> vin;
  float fVar1;
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar2;
  reference ptr;
  reference pvVar3;
  size_t sVar4;
  reference pvVar5;
  PixelFormat in_EDX;
  int *in_RDI;
  float in_XMM0_Da;
  char *in_stack_00000008;
  int in_stack_00000014;
  char *in_stack_00000018;
  LogLevel in_stack_00000024;
  Image *in_stack_ffffffffffffff68;
  Tuple2<pbrt::Point2,_int> in_stack_ffffffffffffff70;
  Tuple2<pbrt::Point2,_int> p_00;
  ColorEncodingHandle *in_stack_ffffffffffffff80;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this_00;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this_01;
  int *piVar6;
  undefined4 in_stack_ffffffffffffff98;
  int iVar7;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffbc;
  Half in_stack_ffffffffffffffbe;
  undefined8 in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  LogLevel in_stack_ffffffffffffffd4;
  int *in_stack_ffffffffffffffe0;
  float local_18;
  PixelFormat local_14;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  local_18 = in_XMM0_Da;
  local_14 = in_EDX;
  eVar2 = IsNaN<float>(0.0);
  if (eVar2) {
    if (LOGGING_LogLevel < 2) {
      in_stack_ffffffffffffff68 = (Image *)&stack0xffffffffffffffec;
      Log<int&,int&,int&>(in_stack_ffffffffffffffd4,(char *)in_stack_ffffffffffffffc8,iVar7,
                          (char *)CONCAT26(in_stack_ffffffffffffffbe.h,
                                           CONCAT24(in_stack_ffffffffffffffbc,
                                                    in_stack_ffffffffffffffb8)),
                          (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffe0);
    }
    local_18 = 0.0;
  }
  fVar1 = local_18;
  iVar7 = *in_RDI;
  if (iVar7 == 0) {
    piVar6 = in_RDI + 0x2c;
    pstd::span<const_float>::span((span<const_float> *)&stack0xffffffffffffffd8,&local_18,1);
    this_01 = (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
              (in_RDI + 0x2e);
    sVar4 = PixelOffset(in_stack_ffffffffffffff68,(Point2i)in_stack_ffffffffffffff70);
    ptr = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator[]
                    (this_01,sVar4 + (long)(int)local_14);
    pstd::span<unsigned_char>::span((span<unsigned_char> *)&stack0xffffffffffffffc8,ptr,1);
    vin.ptr._4_4_ = iVar7;
    vin.ptr._0_4_ = in_stack_ffffffffffffff98;
    vin.n = (size_t)in_RDI;
    vout.n = (size_t)piVar6;
    vout.ptr = (uchar *)this_01;
    ColorEncodingHandle::FromLinear(in_stack_ffffffffffffff80,vin,vout);
  }
  else if (iVar7 == 1) {
    Half::Half((Half *)&stack0xffffffffffffffbe,local_18);
    this_00 = (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)(in_RDI + 0x36);
    sVar4 = PixelOffset(in_stack_ffffffffffffff68,(Point2i)in_stack_ffffffffffffff70);
    pvVar3 = pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator[]
                       (this_00,sVar4 + (long)(int)local_14);
    pvVar3->h = in_stack_ffffffffffffffbe.h;
  }
  else {
    if (iVar7 != 2) {
      LogFatal(in_stack_00000024,in_stack_00000018,in_stack_00000014,in_stack_00000008);
    }
    p_00 = (Tuple2<pbrt::Point2,_int>)(in_RDI + 0x3e);
    sVar4 = PixelOffset(in_stack_ffffffffffffff68,(Point2i)p_00);
    pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)p_00,
                        sVar4 + (long)(int)local_14);
    *pvVar5 = fVar1;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void SetChannel(Point2i p, int c, Float value) {
        // CHECK(!IsNaN(value));
        if (IsNaN(value)) {
#ifndef PBRT_IS_GPU_CODE
            LOG_ERROR("NaN at pixel %d,%d comp %d", p.x, p.y, c);
#endif
            value = 0;
        }

        switch (format) {
        case PixelFormat::U256:
            encoding.FromLinear({&value, 1}, {&p8[PixelOffset(p) + c], 1});
            break;
        case PixelFormat::Half:
            p16[PixelOffset(p) + c] = Half(value);
            break;
        case PixelFormat::Float:
            p32[PixelOffset(p) + c] = value;
            break;
        default:
            LOG_FATAL("Unhandled PixelFormat in Image::SetChannel()");
        }
    }